

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O2

size_t encode_bgp_capabilities_to_buffer(uchar *buffer,size_t start_point)

{
  uchar *puVar1;
  
  puVar1 = buffer + start_point;
  puVar1[0] = '\x02';
  puVar1[1] = '\x06';
  puVar1[2] = '\x01';
  puVar1[3] = '\x04';
  (buffer + start_point + 4)[0] = '\0';
  (buffer + start_point + 4)[1] = '\x01';
  puVar1 = buffer + start_point + 6;
  puVar1[0] = '\0';
  puVar1[1] = '\x01';
  puVar1[2] = '\x02';
  puVar1[3] = '\x06';
  (buffer + start_point + 10)[0] = 'A';
  (buffer + start_point + 10)[1] = '\x04';
  *(uint32_t *)(buffer + start_point + 0xc) =
       my_as >> 0x18 | (my_as & 0xff0000) >> 8 | (my_as & 0xff00) << 8 | my_as << 0x18;
  return 0x10;
}

Assistant:

size_t encode_bgp_capabilities_to_buffer(unsigned char* buffer, size_t start_point){
    size_t pointer = start_point;

    /** MP BGP **/
    buffer[pointer++] = CAPABILITIES;
    buffer[pointer++] = 6;
    buffer[pointer++] = MULTIPROTOCOL_EXTENSION_FOR_BGP4;
    buffer[pointer++] = 4;
    uint16_t afi = htons(afi::IPV4);
    memcpy(&buffer[pointer], &afi, 2);
    pointer += 2;
    buffer[pointer++] = 0; // Reserved
    buffer[pointer++] = safi::UNICAST;

    /** 4-octet AS number **/
    buffer[pointer++] = CAPABILITIES;
    buffer[pointer++] = 6;
    buffer[pointer++] = SUPPORT_FOR_4_OCTET_AS_NUMBER_CAPABILITY;
    buffer[pointer++] = 4;
    uint32_t asn = htonl(my_as);
    memcpy(&buffer[pointer], &asn, 4);
    pointer += 4;

    return pointer - start_point;
}